

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep)

{
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)this);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,
             &(this->leafHeapBucket).
              super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *)&this->smallNormalWithBarrierHeapBucket);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *)&this->smallFinalizableWithBarrierHeapBucket);
  RecyclerSweep::
  TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,
             (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *)
             &this->finalizableHeapBucket);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::TransferPendingEmptyHeapBlocks(RecyclerSweep& recyclerSweep)
{
    recyclerSweep.TransferPendingEmptyHeapBlocks(&heapBucket);
    recyclerSweep.TransferPendingEmptyHeapBlocks(&leafHeapBucket);
#ifdef RECYCLER_WRITE_BARRIER
    recyclerSweep.TransferPendingEmptyHeapBlocks(&smallNormalWithBarrierHeapBucket);
    recyclerSweep.TransferPendingEmptyHeapBlocks(&smallFinalizableWithBarrierHeapBucket);
#endif
    recyclerSweep.TransferPendingEmptyHeapBlocks(&finalizableHeapBucket);
#ifdef RECYCLER_VISITED_HOST
    recyclerSweep.TransferPendingEmptyHeapBlocks(&recyclerVisitedHostHeapBucket);
#endif
}